

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::AttributeBegin(ParsedScene *this,FileLoc loc)

{
  pointer *pppVar1;
  iterator __position;
  pair<char,_pbrt::FileLoc> local_30;
  
  if (this->currentBlock != OptionsBlock) {
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::push_back(&this->pushedGraphicsStates,&this->graphicsState);
    local_30.first = 'a';
    local_30.second.line = loc.line;
    local_30.second.column = loc.column;
    local_30.second.filename._M_len = loc.filename._M_len;
    local_30.second.filename._M_str = loc.filename._M_str;
    __position._M_current =
         (this->pushStack).
         super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->pushStack).
        super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
      _M_realloc_insert<std::pair<char,pbrt::FileLoc>>
                ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                  *)&this->pushStack,__position,&local_30);
    }
    else {
      *(ulong *)__position._M_current = CONCAT71(local_30._1_7_,0x61);
      ((__position._M_current)->second).filename._M_len = loc.filename._M_len;
      ((__position._M_current)->second).filename._M_str = loc.filename._M_str;
      ((__position._M_current)->second).line = loc.line;
      ((__position._M_current)->second).column = loc.column;
      pppVar1 = &(this->pushStack).
                 super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    return;
  }
  ErrorExit<char_const(&)[15]>
            (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [15])0x280a825);
}

Assistant:

void ParsedScene::AttributeBegin(FileLoc loc) {
    VERIFY_WORLD("AttributeBegin");
    pushedGraphicsStates.push_back(graphicsState);
    pushStack.push_back(std::make_pair('a', loc));
}